

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmTargetTraceDependencies::FollowName(cmTargetTraceDependencies *this,string *name)

{
  cmTarget *this_00;
  bool bVar1;
  pointer ppVar2;
  string *psVar3;
  bool local_129;
  cmSourceFile *local_128;
  cmSourceFile *sf;
  cmTarget *t;
  _Base_ptr local_110;
  cmSourcesWithOutput local_108;
  string local_e0;
  cmAlphaNum local_c0;
  cmAlphaNum local_90;
  undefined1 local_60 [8];
  string fullname;
  cmSourcesWithOutput sources;
  _Self local_20;
  iterator i;
  string *name_local;
  cmTargetTraceDependencies *this_local;
  
  i._M_node = (_Base_ptr)name;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourcesWithOutput,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourcesWithOutput>_>_>
       ::lower_bound(&this->NameMap,name);
  sources._16_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourcesWithOutput,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourcesWithOutput>_>_>
       ::end(&this->NameMap);
  bVar1 = std::operator==(&local_20,(_Self *)&sources.SourceIsByproduct);
  local_129 = true;
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourcesWithOutput>_>
             ::operator->(&local_20);
    local_129 = std::operator!=(&ppVar2->first,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )i._M_node);
  }
  if (local_129 != false) {
    cmLocalGenerator::GetSourcesWithOutput
              ((cmSourcesWithOutput *)((long)&fullname.field_2 + 8),this->LocalGenerator,
               (string *)i._M_node);
    if (((fullname.field_2._8_8_ == 0) && (sources.Target == (cmTarget *)0x0)) &&
       (bVar1 = cmsys::SystemTools::FileIsFullPath((string *)i._M_node), !bVar1)) {
      psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this->Makefile);
      cmAlphaNum::cmAlphaNum(&local_90,psVar3);
      cmAlphaNum::cmAlphaNum(&local_c0,'/');
      cmStrCat<std::__cxx11::string>
                ((string *)local_60,&local_90,&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)i._M_node);
      psVar3 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(this->Makefile);
      cmsys::SystemTools::CollapseFullPath(&local_e0,(string *)local_60,psVar3);
      std::__cxx11::string::operator=((string *)local_60,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      cmLocalGenerator::GetSourcesWithOutput(&local_108,this->LocalGenerator,(string *)local_60);
      fullname.field_2._8_8_ = local_108.Target;
      sources.Target = (cmTarget *)local_108.Source;
      sources.Source._0_1_ = local_108.SourceIsByproduct;
      std::__cxx11::string::~string((string *)local_60);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourcesWithOutput>_>
    ::_Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourcesWithOutput>_>
                *)&t,&local_20);
    local_110 = (_Base_ptr)
                std::
                map<std::__cxx11::string,cmSourcesWithOutput,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmSourcesWithOutput>>>
                ::emplace_hint<std::__cxx11::string_const&,cmSourcesWithOutput&>
                          ((map<std::__cxx11::string,cmSourcesWithOutput,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmSourcesWithOutput>>>
                            *)&this->NameMap,(const_iterator)t,i._M_node,
                           (cmSourcesWithOutput *)((long)&fullname.field_2 + 8));
    local_20._M_node = local_110;
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourcesWithOutput>_>
           ::operator->(&local_20);
  sf = (cmSourceFile *)(ppVar2->second).Target;
  if (sf != (cmSourceFile *)0x0) {
    this_00 = this->GeneratorTarget->Target;
    psVar3 = cmTarget::GetName_abi_cxx11_((cmTarget *)sf);
    cmTarget::AddUtility(this_00,psVar3,false,(cmMakefile *)0x0);
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourcesWithOutput>_>
           ::operator->(&local_20);
  local_128 = (ppVar2->second).Source;
  if ((local_128 != (cmSourceFile *)0x0) &&
     (ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourcesWithOutput>_>
               ::operator->(&local_20), ((ppVar2->second).SourceIsByproduct & 1U) == 0)) {
    if (this->CurrentEntry != (SourceEntry *)0x0) {
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                (&this->CurrentEntry->Depends,&local_128);
    }
    QueueSource(this,local_128);
  }
  return;
}

Assistant:

void cmTargetTraceDependencies::FollowName(std::string const& name)
{
  // Use lower bound with key comparison to not repeat the search for the
  // insert position if the name could not be found (which is the common case).
  auto i = this->NameMap.lower_bound(name);
  if (i == this->NameMap.end() || i->first != name) {
    // Check if we know how to generate this file.
    cmSourcesWithOutput sources =
      this->LocalGenerator->GetSourcesWithOutput(name);
    // If we failed to find a target or source and we have a relative path, it
    // might be a valid source if made relative to the current binary
    // directory.
    if (!sources.Target && !sources.Source &&
        !cmSystemTools::FileIsFullPath(name)) {
      auto fullname =
        cmStrCat(this->Makefile->GetCurrentBinaryDirectory(), '/', name);
      fullname = cmSystemTools::CollapseFullPath(
        fullname, this->Makefile->GetHomeOutputDirectory());
      sources = this->LocalGenerator->GetSourcesWithOutput(fullname);
    }
    i = this->NameMap.emplace_hint(i, name, sources);
  }
  if (cmTarget* t = i->second.Target) {
    // The name is a byproduct of a utility target or a PRE_BUILD, PRE_LINK, or
    // POST_BUILD command.
    this->GeneratorTarget->Target->AddUtility(t->GetName(), false);
  }
  if (cmSourceFile* sf = i->second.Source) {
    // For now only follow the dependency if the source file is not a
    // byproduct.  Semantics of byproducts in a non-Ninja context will have to
    // be defined first.
    if (!i->second.SourceIsByproduct) {
      // Record the dependency we just followed.
      if (this->CurrentEntry) {
        this->CurrentEntry->Depends.push_back(sf);
      }
      this->QueueSource(sf);
    }
  }
}